

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.h
# Opt level: O0

type draco::ConvertSymbolToSignedInt<unsigned_int>(uint val)

{
  SignedType ret;
  bool is_positive;
  uint val_local;
  undefined4 local_4;
  
  local_4 = val >> 1;
  if ((val & 1) != 0) {
    local_4 = 0xffffffff - local_4;
  }
  return local_4;
}

Assistant:

typename std::make_signed<IntTypeT>::type ConvertSymbolToSignedInt(
    IntTypeT val) {
  static_assert(std::is_integral<IntTypeT>::value, "IntTypeT is not integral.");
  typedef typename std::make_signed<IntTypeT>::type SignedType;
  const bool is_positive = !static_cast<bool>(val & 1);
  val >>= 1;
  if (is_positive) {
    return static_cast<SignedType>(val);
  }
  SignedType ret = static_cast<SignedType>(val);
  ret = -ret - 1;
  return ret;
}